

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineCancellationTest.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_67cc9::SimpleTask::start(SimpleTask *this,TaskInterface ti)

{
  size_type sVar1;
  reference key;
  int local_24;
  int e;
  int i;
  SimpleTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (SimpleTask *)ti.impl;
  local_24 = 0;
  sVar1 = std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::size
                    (&this->inputs);
  for (; local_24 != (int)sVar1; local_24 = local_24 + 1) {
    key = std::vector<llbuild::core::KeyType,_std::allocator<llbuild::core::KeyType>_>::operator[]
                    (&this->inputs,(long)local_24);
    llbuild::core::TaskInterface::request((TaskInterface *)&this_local,key,(long)local_24);
  }
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Compute the list of inputs.
    auto inputs = listInputs();

    // Request all of the inputs.
    inputValues.resize(inputs.size());
    for (int i = 0, e = inputs.size(); i != e; ++i) {
      ti.request(inputs[i], i);
    }
  }